

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

void fake_clib_func(_func_void_int_void_ptr *callback,void *user)

{
  ostream *poVar1;
  void *user_local;
  _func_void_int_void_ptr *callback_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"before");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (*callback)(0x2a,user);
  poVar1 = std::operator<<((ostream *)&std::cout,"after");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fake_clib_func(void (*callback)(int input, void *user), void *user) {
  std::cout << "before" << std::endl;
  callback(42, user);
  std::cout << "after" << std::endl;
}